

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O0

int cat(int argc,char **argv)

{
  FILE *pFVar1;
  ulonglong uVar2;
  long lVar3;
  undefined8 uVar4;
  size_t sVar5;
  int *piVar6;
  char *pcVar7;
  undefined1 local_2050 [8];
  zip_error_t error;
  undefined1 local_2038 [4];
  int err;
  char buf [8192];
  zip_file_t *zf;
  zip_int64_t n;
  zip_uint64_t idx;
  char **argv_local;
  int argc_local;
  
  uVar2 = strtoull(*argv,(char **)0x0,10);
  lVar3 = zip_fopen_index(za,uVar2,0);
  pFVar1 = _stderr;
  if (lVar3 == 0) {
    uVar4 = zip_strerror(za);
    fprintf(pFVar1,"can\'t open file at index \'%lu\': %s\n",uVar2,uVar4);
  }
  else {
    do {
      sVar5 = zip_fread(lVar3,local_2038,0x2000);
      pFVar1 = _stderr;
      if ((long)sVar5 < 1) {
        if (sVar5 == 0xffffffffffffffff) {
          uVar4 = zip_file_strerror(lVar3);
          fprintf(pFVar1,"can\'t read file at index \'%lu\': %s\n",uVar2,uVar4);
          zip_fclose(lVar3);
          return -1;
        }
        error.str._4_4_ = zip_fclose(lVar3);
        if (error.str._4_4_ != 0) {
          zip_error_init_with_code(local_2050,error.str._4_4_);
          pFVar1 = _stderr;
          uVar4 = zip_error_strerror(local_2050);
          fprintf(pFVar1,"can\'t close file at index \'%lu\': %s\n",uVar2,uVar4);
          return -1;
        }
        return 0;
      }
      sVar5 = fwrite(local_2038,sVar5,1,_stdout);
    } while (sVar5 == 1);
    zip_fclose(lVar3);
    pFVar1 = _stderr;
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    fprintf(pFVar1,"can\'t write file contents to stdout: %s\n",pcVar7);
  }
  return -1;
}

Assistant:

static int
cat(int argc, char *argv[]) {
    /* output file contents to stdout */
    zip_uint64_t idx;
    zip_int64_t n;
    zip_file_t *zf;
    char buf[8192];
    int err;
    idx = strtoull(argv[0], NULL, 10);

#ifdef _WIN32
    /* Need to set stdout to binary mode for Windows */
    setmode(fileno(stdout), _O_BINARY);
#endif
    if ((zf = zip_fopen_index(za, idx, 0)) == NULL) {
	fprintf(stderr, "can't open file at index '%" PRIu64 "': %s\n", idx, zip_strerror(za));
	return -1;
    }
    while ((n = zip_fread(zf, buf, sizeof(buf))) > 0) {
	if (fwrite(buf, (size_t)n, 1, stdout) != 1) {
	    zip_fclose(zf);
	    fprintf(stderr, "can't write file contents to stdout: %s\n", strerror(errno));
	    return -1;
	}
    }
    if (n == -1) {
	fprintf(stderr, "can't read file at index '%" PRIu64 "': %s\n", idx, zip_file_strerror(zf));
	zip_fclose(zf);
	return -1;
    }
    if ((err = zip_fclose(zf)) != 0) {
	zip_error_t error;

	zip_error_init_with_code(&error, err);
	fprintf(stderr, "can't close file at index '%" PRIu64 "': %s\n", idx, zip_error_strerror(&error));
	return -1;
    }

    return 0;
}